

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
node::BlockManager::ReadBlockFromDisk(BlockManager *this,CBlock *block,CBlockIndex *index)

{
  uint256 *puVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  FlatFilePos FVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string_view str;
  string_view logging_function;
  FlatFilePos block_pos;
  string log_msg;
  FlatFilePos local_148 [2];
  string local_138;
  string local_118 [5];
  string local_70;
  undefined1 local_50 [8];
  undefined8 uStack_48;
  undefined1 local_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 uStack_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined8 local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (undefined1  [8])&cs_main;
  uStack_48 = uStack_48 & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_50);
  bVar4 = false;
  FVar5.nFile = -(uint)((index->nStatus & 8) == 0) | index->nFile;
  FVar5.nPos = (int)(index->nStatus << 0x1c) >> 0x1f & index->nDataPos;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_50);
  local_148[0] = FVar5;
  bVar2 = ReadBlockFromDisk(this,block,local_148);
  if (bVar2) {
    CBlockHeader::GetHash((uint256 *)local_50,&block->super_CBlockHeader);
    puVar1 = index->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    auVar7[0] = -(local_50[0] == (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
    auVar7[1] = -(local_50[1] == (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
    auVar7[2] = -(local_50[2] == (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
    auVar7[3] = -(local_50[3] == (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
    auVar7[4] = -(local_50[4] == (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
    auVar7[5] = -(local_50[5] == (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
    auVar7[6] = -(local_50[6] == (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
    auVar7[7] = -(local_50[7] == (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
    auVar7[8] = -(uStack_48._0_1_ == (bool)(puVar1->super_base_blob<256U>).m_data._M_elems[8]);
    auVar7[9] = -(uStack_48._1_1_ == (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
    auVar7[10] = -(uStack_48._2_1_ == (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
    auVar7[0xb] = -(uStack_48._3_1_ == (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
    auVar7[0xc] = -(uStack_48._4_1_ == (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
    auVar7[0xd] = -(uStack_48._5_1_ == (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
    auVar7[0xe] = -(uStack_48._6_1_ == (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
    auVar7[0xf] = -(uStack_48._7_1_ == (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
    auVar6[0] = -(local_40 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x10]);
    auVar6[1] = -(uStack_3f == (puVar1->super_base_blob<256U>).m_data._M_elems[0x11]);
    auVar6[2] = -(uStack_3e == (puVar1->super_base_blob<256U>).m_data._M_elems[0x12]);
    auVar6[3] = -(uStack_3d == (puVar1->super_base_blob<256U>).m_data._M_elems[0x13]);
    auVar6[4] = -(uStack_3c == (puVar1->super_base_blob<256U>).m_data._M_elems[0x14]);
    auVar6[5] = -(uStack_3b == (puVar1->super_base_blob<256U>).m_data._M_elems[0x15]);
    auVar6[6] = -(uStack_3a == (puVar1->super_base_blob<256U>).m_data._M_elems[0x16]);
    auVar6[7] = -(uStack_39 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x17]);
    auVar6[8] = -(uStack_38 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x18]);
    auVar6[9] = -(uStack_37 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x19]);
    auVar6[10] = -(uStack_36 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a]);
    auVar6[0xb] = -(uStack_35 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b]);
    auVar6[0xc] = -(uStack_34 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c]);
    auVar6[0xd] = -(uStack_33 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d]);
    auVar6[0xe] = -(uStack_32 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e]);
    auVar6[0xf] = -(uStack_31 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f]);
    auVar6 = auVar6 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
      bVar4 = true;
    }
    else {
      CBlockIndex::ToString_abi_cxx11_(local_118,index);
      FlatFilePos::ToString_abi_cxx11_(&local_138,local_148);
      pLVar3 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar3);
      if (bVar2) {
        uStack_48 = 0;
        local_40 = '\0';
        local_50 = (undefined1  [8])&stack0xffffffffffffffc0;
        tinyformat::format<char[18],std::__cxx11::string,std::__cxx11::string>
                  (&local_70,(tinyformat *)"%s: GetHash() doesn\'t match index for %s at %s\n",
                   "ReadBlockFromDisk",(char (*) [18])local_118,&local_138,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pLVar3 = LogInstance();
        local_70._M_dataplus._M_p = (pointer)0x5e;
        local_70._M_string_length = 0xfa6684;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file._M_len = 0x5e;
        str._M_str = (char *)local_50;
        str._M_len = uStack_48;
        logging_function._M_str = "ReadBlockFromDisk";
        logging_function._M_len = 0x11;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x437,ALL,Error);
        if (local_50 != (undefined1  [8])&stack0xffffffffffffffc0) {
          operator_delete((void *)local_50,
                          CONCAT17(uStack_39,
                                   CONCAT16(uStack_3a,
                                            CONCAT15(uStack_3b,
                                                     CONCAT14(uStack_3c,
                                                              CONCAT13(uStack_3d,
                                                                       CONCAT12(uStack_3e,
                                                                                CONCAT11(uStack_3f,
                                                                                         local_40)))
                                                             )))) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
        operator_delete(local_118[0]._M_dataplus._M_p,local_118[0].field_2._M_allocated_capacity + 1
                       );
      }
      bVar4 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadBlockFromDisk(CBlock& block, const CBlockIndex& index) const
{
    const FlatFilePos block_pos{WITH_LOCK(cs_main, return index.GetBlockPos())};

    if (!ReadBlockFromDisk(block, block_pos)) {
        return false;
    }
    if (block.GetHash() != index.GetBlockHash()) {
        LogError("%s: GetHash() doesn't match index for %s at %s\n", __func__, index.ToString(), block_pos.ToString());
        return false;
    }
    return true;
}